

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSAPublicKey.cpp
# Opt level: O0

void __thiscall OSSLDSAPublicKey::createOSSLKey(OSSLDSAPublicKey *this)

{
  DSA *pDVar1;
  DSA_METHOD *pDVar2;
  BIGNUM *pBVar3;
  BIGNUM *pBVar4;
  BIGNUM *pBVar5;
  BIGNUM *pBVar6;
  long in_RDI;
  BIGNUM *bn_pub_key;
  BIGNUM *bn_g;
  BIGNUM *bn_q;
  BIGNUM *bn_p;
  
  if (*(long *)(in_RDI + 0xa8) == 0) {
    pDVar1 = DSA_new();
    *(DSA **)(in_RDI + 0xa8) = pDVar1;
    if (*(long *)(in_RDI + 0xa8) == 0) {
      softHSMLog(3,"createOSSLKey",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLDSAPublicKey.cpp"
                 ,0xa6,"Could not create DSA object");
    }
    else {
      pDVar1 = *(DSA **)(in_RDI + 0xa8);
      pDVar2 = DSA_OpenSSL();
      DSA_set_method(pDVar1,pDVar2);
      pBVar3 = OSSL::byteString2bn((ByteString *)pDVar1);
      pBVar4 = OSSL::byteString2bn((ByteString *)pDVar1);
      pBVar5 = OSSL::byteString2bn((ByteString *)pDVar1);
      pBVar6 = OSSL::byteString2bn((ByteString *)pDVar1);
      DSA_set0_pqg(*(undefined8 *)(in_RDI + 0xa8),pBVar3,pBVar4,pBVar5);
      DSA_set0_key(*(undefined8 *)(in_RDI + 0xa8),pBVar6,0);
    }
  }
  return;
}

Assistant:

void OSSLDSAPublicKey::createOSSLKey()
{
	if (dsa != NULL) return;

	dsa = DSA_new();
	if (dsa == NULL)
	{
		ERROR_MSG("Could not create DSA object");
		return;
	}

	// Use the OpenSSL implementation and not any engine
#if OPENSSL_VERSION_NUMBER < 0x10100000L || defined(LIBRESSL_VERSION_NUMBER)

#ifdef WITH_FIPS
	if (FIPS_mode())
		DSA_set_method(dsa, FIPS_dsa_openssl());
	else
		DSA_set_method(dsa, DSA_OpenSSL());
#else
	DSA_set_method(dsa, DSA_OpenSSL());
#endif

#else
	DSA_set_method(dsa, DSA_OpenSSL());
#endif

	BIGNUM* bn_p = OSSL::byteString2bn(p);
	BIGNUM* bn_q = OSSL::byteString2bn(q);
	BIGNUM* bn_g = OSSL::byteString2bn(g);
	BIGNUM* bn_pub_key = OSSL::byteString2bn(y);

	DSA_set0_pqg(dsa, bn_p, bn_q, bn_g);
	DSA_set0_key(dsa, bn_pub_key, NULL);
}